

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O0

size_t compressBulk(SymbolTable *symbolTable,size_t nlines,size_t *lenIn,u8 **strIn,size_t size,
                   u8 *out,size_t *lenOut,u8 **strOut,bool noSuffixOpt,bool avoidBranch)

{
  u8 *in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  size_t *in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  byte in_stack_00000018;
  size_t curOff;
  size_t chunk;
  anon_class_48_6_3eb800b7 compressVariant;
  u8 buf [519];
  u8 byteLim;
  size_t suffixLim;
  size_t curLine;
  u8 *lim;
  u8 *end;
  u8 *cur;
  ulong local_2b8;
  size_t local_2b0;
  bool avoidBranch_00;
  bool noSuffixOpt_00;
  anon_class_48_6_3eb800b7 *this;
  u8 *local_278 [65];
  char local_69;
  ulong local_68;
  ulong local_60;
  long local_58;
  anon_class_48_6_3eb800b7 local_50;
  long local_20;
  ulong local_18;
  long local_10;
  
  local_50.symbolTable._7_1_ = in_stack_00000018 & 1;
  local_50.symbolTable._6_1_ = (byte)curOff & 1;
  local_50.end = (u8 **)0x0;
  local_50.cur = (u8 **)0x0;
  local_58 = (long)in_R9 + in_R8;
  local_68 = (ulong)*(ushort *)(in_RDI + 0x26202);
  local_69 = ((char)*(undefined2 *)(in_RDI + 0x26200) + (*(byte *)(in_RDI + 0x26206) & 1)) -
             (char)*(undefined2 *)(in_RDI + 0x26208);
  local_50.suffixLim = in_R9;
  local_50.byteLim = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_278,0,0x207);
  this = &local_50;
  local_60 = 0;
  do {
    if (local_18 <= local_60) {
      return local_60;
    }
    local_2b8 = 0;
    *(size_t **)(in_stack_00000010 + local_60 * 8) = local_50.suffixLim;
    do {
      local_50.end = (u8 **)(*(long *)(local_50.byteLim + local_60 * 8) + local_2b8);
      local_2b0 = *(long *)(local_20 + local_60 * 8) - local_2b8;
      if (0x1ff < local_2b0) {
        local_2b0 = 0x1ff;
      }
      if ((ulong)(local_58 - (long)local_50.suffixLim) < local_2b0 * 2 + 7) {
        return local_60;
      }
      memcpy(local_278,local_50.end,local_2b0);
      *(char *)((long)local_278 + local_2b0) = (char)*(undefined2 *)(local_10 + 0x26204);
      local_50.end = local_278;
      local_50.cur = (u8 **)((long)local_50.end + local_2b0);
      avoidBranch_00 = SUB81((ulong)&local_50.end >> 0x30,0);
      noSuffixOpt_00 = SUB81((ulong)&local_50.end >> 0x38,0);
      if ((local_50.symbolTable._7_1_ & 1) == 0) {
        if ((local_50.symbolTable._6_1_ & 1) == 0) {
          compressBulk::anon_class_48_6_3eb800b7::operator()(this,noSuffixOpt_00,avoidBranch_00);
        }
        else {
          compressBulk::anon_class_48_6_3eb800b7::operator()(this,noSuffixOpt_00,avoidBranch_00);
        }
      }
      else {
        compressBulk::anon_class_48_6_3eb800b7::operator()(this,noSuffixOpt_00,avoidBranch_00);
      }
      local_2b8 = local_2b0 + local_2b8;
    } while (local_2b8 < *(ulong *)(local_20 + local_60 * 8));
    *(long *)(in_stack_00000008 + local_60 * 8) =
         (long)local_50.suffixLim - *(long *)(in_stack_00000010 + local_60 * 8);
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

static inline size_t compressBulk(SymbolTable &symbolTable, size_t nlines, size_t lenIn[], u8* strIn[], size_t size, u8* out, size_t lenOut[], u8* strOut[], bool noSuffixOpt, bool avoidBranch) {
	u8 *cur = NULL, *end =  NULL, *lim = out + size;
	size_t curLine, suffixLim = symbolTable.suffixLim;
	u8 byteLim = symbolTable.nSymbols + symbolTable.zeroTerminated - symbolTable.lenHisto[0];

	u8 buf[512+7] = {}; /* +7 sentinel is to avoid 8-byte unaligned-loads going beyond 511 out-of-bounds */

	// three variants are possible. dead code falls away since the bool arguments are constants
	auto compressVariant = [&](bool noSuffixOpt, bool avoidBranch) {
		while (cur < end) {
			u64 word = fsst_unaligned_load(cur);
			size_t code = symbolTable.shortCodes[word & 0xFFFF];
			if (noSuffixOpt && ((u8) code) < suffixLim) {
				// 2 byte code without having to worry about longer matches
				*out++ = (u8) code; cur += 2;
			} else {
				size_t pos = word & 0xFFFFFF;
				size_t idx = FSST_HASH(pos)&(symbolTable.hashTabSize-1);
				Symbol s = symbolTable.hashTab[idx];
				out[1] = (u8) word; // speculatively write out escaped byte
				word &= (0xFFFFFFFFFFFFFFFF >> (u8) s.icl);
				if ((s.icl < FSST_ICL_FREE) && s.val.num == word) {
					*out++ = (u8) s.code(); cur += s.length();
				} else if (avoidBranch) {
					// could be a 2-byte or 1-byte code, or miss
					// handle everything with predication
					*out = (u8) code;
					out += 1+((code&FSST_CODE_BASE)>>8);
					cur += (code>>FSST_LEN_BITS);
				} else if ((u8) code < byteLim) {
					// 2 byte code after checking there is no longer pattern
					*out++ = (u8) code; cur += 2;
				} else {
					// 1 byte code or miss.
					*out = (u8) code;
					out += 1+((code&FSST_CODE_BASE)>>8); // predicated - tested with a branch, that was always worse
					cur++;
				}
			}
		}
	};

	for(curLine=0; curLine<nlines; curLine++) {
		size_t chunk, curOff = 0;
		strOut[curLine] = out;
		do {
			cur = strIn[curLine] + curOff;
			chunk = lenIn[curLine] - curOff;
			if (chunk > 511) {
				chunk = 511; // we need to compress in chunks of 511 in order to be byte-compatible with simd-compressed FSST
			}
			if ((2*chunk+7) > (size_t) (lim-out)) {
				return curLine; // out of memory
			}
			// copy the string to the 511-byte buffer
			memcpy(buf, cur, chunk);
			buf[chunk] = (u8) symbolTable.terminator;
			cur = buf;
			end = cur + chunk;

			// based on symboltable stats, choose a variant that is nice to the branch predictor
			if (noSuffixOpt) {
				compressVariant(true,false);
			} else if (avoidBranch) {
				compressVariant(false,true);
			} else {
				compressVariant(false, false);
			}
		} while((curOff += chunk) < lenIn[curLine]);
		lenOut[curLine] = (size_t) (out - strOut[curLine]);
	}
	return curLine;
}